

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BoxArray.H
# Opt level: O2

Box * __thiscall
amrex::BATindexType::operator()(Box *__return_storage_ptr__,BATindexType *this,Box *bx)

{
  uint uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  int dir;
  uint uVar5;
  long lVar6;
  uint uVar7;
  
  uVar2 = *(undefined8 *)(bx->smallend).vect;
  uVar3 = *(undefined8 *)((bx->smallend).vect + 2);
  uVar4 = *(undefined8 *)((bx->bigend).vect + 2);
  *(undefined8 *)(__return_storage_ptr__->bigend).vect = *(undefined8 *)(bx->bigend).vect;
  *(undefined8 *)((__return_storage_ptr__->bigend).vect + 2) = uVar4;
  *(undefined8 *)(__return_storage_ptr__->smallend).vect = uVar2;
  *(undefined8 *)((__return_storage_ptr__->smallend).vect + 2) = uVar3;
  uVar1 = (this->m_typ).itype;
  for (lVar6 = 0; lVar6 != 3; lVar6 = lVar6 + 1) {
    uVar7 = 1 << ((byte)lVar6 & 0x1f);
    uVar5 = (uint)lVar6;
    (__return_storage_ptr__->bigend).vect[lVar6] =
         ((__return_storage_ptr__->bigend).vect[lVar6] + (uint)((uVar1 >> (uVar5 & 0x1f) & 1) != 0))
         - (uint)(((__return_storage_ptr__->btype).itype >> (uVar5 & 0x1f) & 1) != 0);
    if ((uVar1 >> (uVar5 & 0x1f) & 1) == 0) {
      uVar7 = ~uVar7 & (__return_storage_ptr__->btype).itype;
    }
    else {
      uVar7 = uVar7 | (__return_storage_ptr__->btype).itype;
    }
    (__return_storage_ptr__->btype).itype = uVar7;
  }
  return __return_storage_ptr__;
}

Assistant:

Box operator() (const Box& bx) const noexcept { return amrex::convert(bx,m_typ); }